

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stub.c
# Opt level: O3

int mmk_stub_create_static(mmk_stub *stub,char *target,mmk_fn fn,void *ctx)

{
  int iVar1;
  size_t sVar2;
  char *dst;
  char *pcVar3;
  plt_ctx ctx_00;
  plt_lib lib;
  plt_offset *offset;
  undefined1 *newval;
  char *name;
  long in_FS_OFFSET;
  size_t nb_off;
  size_t local_38;
  
  *(undefined4 *)(in_FS_OFFSET + -0x20) = 0;
  *(undefined8 *)(in_FS_OFFSET + -0x18) = 0;
  sVar2 = mmk_strlen(target);
  dst = (char *)mmk_malloc(sVar2 + 1);
  if (dst == (char *)0x0) {
    iVar1 = -0xc;
  }
  else {
    mmk_strcpy(dst,target);
    pcVar3 = mmk_strchr(dst,0x40);
    if (pcVar3 == (char *)0x0) {
      name = (char *)0x0;
    }
    else {
      *pcVar3 = '\0';
      iVar1 = mmk_streq(pcVar3 + 1,"self");
      name = (char *)0x0;
      if (iVar1 == 0) {
        name = pcVar3 + 1;
      }
    }
    ctx_00 = mmk_plt_ctx();
    lib = plt_get_lib(ctx_00,name);
    if (lib == (plt_lib)0x0) {
      iVar1 = -2;
    }
    else {
      local_38 = 0;
      offset = plt_get_offsets(ctx_00,lib,dst,&local_38);
      iVar1 = -2;
      if (local_38 != 0 && offset != (plt_offset *)0x0) {
        stub->ctx_asked = mmk_ctx_asked;
        stub->ctx_set = mmk_set_ctx;
        stub->ctx_get = mmk_ctx;
        stub->ctx = ctx;
        stub->name = dst;
        stub->path = name;
        stub->offsets = offset;
        stub->nb_offsets = local_38;
        stub->trampoline = (undefined1 *)0x0;
        stub->next = (mmk_stub *)0x0;
        newval = create_trampoline(stub,fn);
        stub->trampoline = newval;
        plt_set_offsets(offset,local_38,newval);
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int mmk_stub_create_static(struct mmk_stub *stub,
        const char *target, mmk_fn fn, void *ctx)
{
    tls_set(int, ask_ctx, 0);
    tls_set(struct mmk_stub *, mmk_ctx_, NULL);

    char *name = mmk_malloc(mmk_strlen(target) + 1);
    if (!name)
        return -ENOMEM;

    mmk_strcpy(name, target);

    char *path = NULL;
    char *delim = mmk_strchr(name, '@');
    if (delim != NULL) {
        *delim = 0;
        path = delim + 1;
    }
    if (path && mmk_streq(path, "self"))
        path = NULL;

    plt_ctx pctx = mmk_plt_ctx();
    plt_lib lib = plt_get_lib(pctx, path);
    if (!lib)
        return -ENOENT;

    size_t nb_off = 0;
    plt_offset *off = plt_get_offsets(pctx, lib, name, &nb_off);
    if (!off || !nb_off)
        return -ENOENT;

    *stub = (struct mmk_stub) {
        .ctx_asked = mmk_ctx_asked,
        .ctx_set = mmk_set_ctx,
        .ctx_get = mmk_ctx,
        .ctx = ctx,
        .name = name,
        .path = path,
        .offsets = off,
        .nb_offsets = nb_off,
    };
    stub->trampoline = create_trampoline(stub, (plt_fn *) fn);
    plt_set_offsets(off, nb_off, stub->trampoline);

    return 0;
}